

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.H
# Opt level: O2

AmrMesh * __thiscall amrex::AmrMesh::operator=(AmrMesh *this,AmrMesh *rhs)

{
  uint uVar1;
  
  AmrInfo::operator=(&this->super_AmrInfo,&rhs->super_AmrInfo);
  *(undefined4 *)&(this->super_AmrInfo).field_0x8c = *(undefined4 *)&(rhs->super_AmrInfo).field_0x8c
  ;
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::_M_move_assign
            (&(this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,
             &rhs->geom);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
  _M_move_assign(&(this->dmap).
                  super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                 ,&rhs->dmap);
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::_M_move_assign
            (&(this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
             &rhs->grids);
  uVar1 = rhs->num_setba;
  this->num_setdm = rhs->num_setdm;
  this->num_setba = uVar1;
  return this;
}

Assistant:

AmrMesh& operator= (AmrMesh&& rhs) = default;